

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O0

void Imf_3_4::wav2Encode(unsigned_short *in,int nx,int ox,int ny,int oy,unsigned_short mx)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  unsigned_short *h;
  unsigned_short *h_00;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  unsigned_short *in_RDI;
  int in_R8D;
  ushort in_R9W;
  unsigned_short *p01_1;
  unsigned_short *ex_1;
  unsigned_short *px_1;
  unsigned_short *p10_1;
  unsigned_short *p11;
  unsigned_short *p10;
  unsigned_short *p01;
  unsigned_short *ex;
  unsigned_short *px;
  unsigned_short i11;
  unsigned_short i10;
  unsigned_short i01;
  unsigned_short i00;
  int ox2;
  int ox1;
  int oy2;
  int oy1;
  unsigned_short *ey;
  unsigned_short *py;
  int p2;
  int p;
  int n;
  bool w14;
  uint local_9c;
  unsigned_short *local_88;
  unsigned_short *local_58;
  unsigned_short local_50;
  unsigned_short local_4e;
  unsigned_short local_4c;
  unsigned_short local_4a;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  unsigned_short *local_38;
  unsigned_short *local_30;
  uint local_28;
  uint local_24;
  uint local_20;
  byte local_1b;
  int local_18;
  uint local_14;
  int local_10;
  uint local_c;
  unsigned_short *local_8;
  
  local_1b = in_R9W < 0x4000;
  local_9c = in_ESI;
  if ((int)in_ECX < (int)in_ESI) {
    local_9c = in_ECX;
  }
  local_20 = local_9c;
  local_24 = 1;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_28 = 2; (int)local_28 <= (int)local_20; local_28 = local_28 << 1) {
    local_38 = local_8 + (int)(local_18 * (local_14 - local_28));
    local_3c = local_18 * local_24;
    local_40 = local_18 * local_28;
    local_44 = local_10 * local_24;
    local_48 = local_10 * local_28;
    for (local_30 = local_8; local_30 <= local_38; local_30 = local_30 + local_40) {
      puVar1 = local_30 + (int)(local_10 * (local_c - local_28));
      for (local_58 = local_30; local_58 <= puVar1; local_58 = local_58 + local_48) {
        puVar2 = local_58 + local_44;
        h = local_58 + local_3c;
        h_00 = h + local_44;
        if ((local_1b & 1) == 0) {
          anon_unknown_0::wenc16(*local_58,*puVar2,&local_4a,&local_4c);
          anon_unknown_0::wenc16(*h,*h_00,&local_4e,&local_50);
          anon_unknown_0::wenc16(local_4a,local_4e,local_58,h);
          anon_unknown_0::wenc16(local_4c,local_50,puVar2,h_00);
        }
        else {
          anon_unknown_0::wenc14(*local_58,*puVar2,&local_4a,&local_4c);
          anon_unknown_0::wenc14(*h,*h_00,&local_4e,&local_50);
          anon_unknown_0::wenc14(local_4a,local_4e,local_58,h);
          anon_unknown_0::wenc14(local_4c,local_50,puVar2,h_00);
        }
      }
      if ((local_c & local_24) != 0) {
        puVar1 = local_58 + local_3c;
        if ((local_1b & 1) == 0) {
          anon_unknown_0::wenc16(*local_58,*puVar1,&local_4a,puVar1);
        }
        else {
          anon_unknown_0::wenc14(*local_58,*puVar1,&local_4a,puVar1);
        }
        *local_58 = local_4a;
      }
    }
    if ((local_14 & local_24) != 0) {
      puVar1 = local_30 + (int)(local_10 * (local_c - local_28));
      for (local_88 = local_30; local_88 <= puVar1; local_88 = local_88 + local_48) {
        puVar2 = local_88 + local_44;
        if ((local_1b & 1) == 0) {
          anon_unknown_0::wenc16(*local_88,*puVar2,&local_4a,puVar2);
        }
        else {
          anon_unknown_0::wenc14(*local_88,*puVar2,&local_4a,puVar2);
        }
        *local_88 = local_4a;
      }
    }
    local_24 = local_28;
  }
  return;
}

Assistant:

void
wav2Encode (
    unsigned short* in, // io: values are transformed in place
    int             nx, // i : x size
    int             ox, // i : x offset
    int             ny, // i : y size
    int             oy, // i : y offset
    unsigned short  mx)  // i : maximum in[x][y] value
{
    bool w14 = (mx < (1 << 14));
    int  n   = (nx > ny) ? ny : nx;
    int  p   = 1; // == 1 <<  level
    int  p2  = 2; // == 1 << (level+1)

    //
    // Hierarchical loop on smaller dimension n
    //

    while (p2 <= n)
    {
        unsigned short* py  = in;
        unsigned short* ey  = in + oy * (ny - p2);
        int             oy1 = oy * p;
        int             oy2 = oy * p2;
        int             ox1 = ox * p;
        int             ox2 = ox * p2;
        unsigned short  i00, i01, i10, i11;

        //
        // Y loop
        //

        for (; py <= ey; py += oy2)
        {
            unsigned short* px = py;
            unsigned short* ex = py + ox * (nx - p2);

            //
            // X loop
            //

            for (; px <= ex; px += ox2)
            {
                unsigned short* p01 = px + ox1;
                unsigned short* p10 = px + oy1;
                unsigned short* p11 = p10 + ox1;

                //
                // 2D wavelet encoding
                //

                if (w14)
                {
                    wenc14 (*px, *p01, i00, i01);
                    wenc14 (*p10, *p11, i10, i11);
                    wenc14 (i00, i10, *px, *p10);
                    wenc14 (i01, i11, *p01, *p11);
                }
                else
                {
                    wenc16 (*px, *p01, i00, i01);
                    wenc16 (*p10, *p11, i10, i11);
                    wenc16 (i00, i10, *px, *p10);
                    wenc16 (i01, i11, *p01, *p11);
                }
            }

            //
            // Encode (1D) odd column (still in Y loop)
            //

            if (nx & p)
            {
                unsigned short* p10 = px + oy1;

                if (w14)
                    wenc14 (*px, *p10, i00, *p10);
                else
                    wenc16 (*px, *p10, i00, *p10);

                *px = i00;
            }
        }

        //
        // Encode (1D) odd line (must loop in X)
        //

        if (ny & p)
        {
            unsigned short* px = py;
            unsigned short* ex = py + ox * (nx - p2);

            for (; px <= ex; px += ox2)
            {
                unsigned short* p01 = px + ox1;

                if (w14)
                    wenc14 (*px, *p01, i00, *p01);
                else
                    wenc16 (*px, *p01, i00, *p01);

                *px = i00;
            }
        }

        //
        // Next level
        //

        p = p2;
        p2 <<= 1;
    }
}